

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextUnformatted(char *text,char *text_end)

{
  bool bVar1;
  size_t sVar2;
  ImRect *in_RSI;
  ImRect *in_RDI;
  ImVec2 IVar3;
  ImRect bb_1;
  ImVec2 text_size_1;
  float wrap_width;
  ImRect bb;
  char *line_end_2;
  int lines_skipped_1;
  ImVec2 line_size;
  char *line_end_1;
  ImRect line_rect;
  char *line_end;
  int lines_skipped;
  int lines_skippable;
  ImVec2 pos;
  ImVec2 text_size;
  ImRect clip_rect;
  float line_height;
  char *line;
  bool wrap_enabled;
  float wrap_pos_x;
  ImVec2 text_pos;
  char *text_begin;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed3;
  float in_stack_fffffffffffffed4;
  ImVec2 *in_stack_fffffffffffffed8;
  ImRect *bb_00;
  ImRect *in_stack_fffffffffffffee8;
  ImVec2 *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float wrap_width_00;
  float fVar4;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar5;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ImVec2 in_stack_ffffffffffffff20;
  ImRect local_d8;
  ImVec2 local_c8;
  ImRect *local_c0;
  int local_b4;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImRect *local_a0;
  ImRect local_98;
  ImRect local_88;
  ImRect *local_78;
  int local_6c;
  int local_68;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  float local_44;
  ImRect *local_40;
  undefined1 local_35;
  float local_34;
  ImVec2 local_30;
  ImRect *local_28;
  ImGuiContext *local_20;
  ImGuiWindow *local_18;
  ImRect *local_10;
  ImRect *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = GetCurrentWindow();
  if ((local_18->SkipItems & 1U) == 0) {
    local_20 = GImGui;
    local_28 = local_8;
    if (local_10 == (ImRect *)0x0) {
      in_stack_fffffffffffffee8 = local_8;
      sVar2 = strlen((char *)local_8);
      local_10 = (ImRect *)((long)&(in_stack_fffffffffffffee8->Min).x + sVar2);
    }
    ImVec2::ImVec2(&local_30,(local_18->DC).CursorPos.x,
                   (local_18->DC).CursorPos.y + (local_18->DC).CurrentLineTextBaseOffset);
    local_34 = (local_18->DC).TextWrapPos;
    local_35 = 0.0 <= local_34;
    if (((long)local_10 - (long)local_8 < 0x7d1) || ((bool)local_35)) {
      if ((bool)local_35) {
        CalcWrapWidthForPos(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      }
      IVar3 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (char *)in_stack_fffffffffffffef0,
                           SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                           SUB84(in_stack_fffffffffffffee8,0));
      fVar5 = IVar3.x;
      IVar3 = operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x179ebd);
      wrap_width_00 = IVar3.x;
      fVar4 = IVar3.y;
      ImRect::ImRect((ImRect *)&stack0xffffffffffffff04,&local_30,(ImVec2 *)&stack0xfffffffffffffefc
                    );
      ItemSize(in_stack_fffffffffffffef0,(float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      bVar1 = ItemAdd((ImRect *)CONCAT44(wrap_width_00,in_stack_fffffffffffffef8),
                      (ImGuiID)((ulong)in_stack_fffffffffffffef0 >> 0x20),in_stack_fffffffffffffee8)
      ;
      if (bVar1) {
        IVar3.y = fVar5;
        IVar3.x = in_stack_ffffffffffffff10;
        RenderTextWrapped(IVar3,(char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ),(char *)CONCAT44(in_stack_ffffffffffffff04,fVar4),
                          wrap_width_00);
      }
    }
    else {
      local_40 = local_8;
      local_44 = GetTextLineHeight();
      local_54 = (local_18->ClipRect).Min;
      local_4c = (local_18->ClipRect).Max;
      ImVec2::ImVec2(&local_5c,0.0,0.0);
      if (local_30.y <= local_4c.y) {
        local_64.y = local_30.y;
        local_64.x = local_30.x;
        if ((local_20->LogEnabled & 1U) == 0) {
          local_68 = (int)((local_54.y - local_30.y) / local_44);
          if (0 < local_68) {
            local_6c = 0;
            while (local_40 < local_10 && local_6c < local_68) {
              local_78 = (ImRect *)memchr(local_40,10,(long)local_10 - (long)local_40);
              if (local_78 == (ImRect *)0x0) {
                local_78 = local_10;
              }
              local_6c = local_6c + 1;
              local_40 = (ImRect *)((long)&(local_78->Min).x + 1);
            }
            local_64.y = (float)local_6c * local_44 + local_64.y;
          }
        }
        if (local_40 < local_10) {
          bb_00 = &local_98;
          ImVec2::ImVec2(&bb_00->Min,3.4028235e+38,local_44);
          local_98.Max = operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x179b8a);
          ImRect::ImRect(&local_88,&local_64,&local_98.Max);
          while ((local_40 < local_10 &&
                 (bVar1 = IsClippedEx(bb_00,(ImGuiID)in_stack_fffffffffffffed4,
                                      (bool)in_stack_fffffffffffffed3), !bVar1))) {
            local_a0 = (ImRect *)memchr(local_40,10,(long)local_10 - (long)local_40);
            if (local_a0 == (ImRect *)0x0) {
              local_a0 = local_10;
            }
            local_a8 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                     in_stack_fffffffffffffef8),
                                    (char *)in_stack_fffffffffffffef0,
                                    SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                                    SUB84(in_stack_fffffffffffffee8,0));
            local_5c.x = ImMax<float>(local_5c.x,local_a8.x);
            local_b0 = local_64;
            RenderText(in_stack_ffffffffffffff20,
                       (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0));
            local_40 = (ImRect *)((long)&(local_a0->Min).x + 1);
            local_88.Min.y = local_44 + local_88.Min.y;
            local_88.Max.y = local_44 + local_88.Max.y;
            local_64.y = local_44 + local_64.y;
          }
          local_b4 = 0;
          while (local_40 < local_10) {
            local_c0 = (ImRect *)memchr(local_40,10,(long)local_10 - (long)local_40);
            if (local_c0 == (ImRect *)0x0) {
              local_c0 = local_10;
            }
            local_b4 = local_b4 + 1;
            local_40 = (ImRect *)((long)&(local_c0->Min).x + 1);
          }
          local_64.y = (float)local_b4 * local_44 + local_64.y;
        }
        local_c8 = operator-(in_stack_fffffffffffffec8,(ImVec2 *)0x179dcd);
        local_5c.y = local_c8.y + local_5c.y;
      }
      operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x179e00);
      ImRect::ImRect(&local_d8,&local_30,(ImVec2 *)&stack0xffffffffffffff20);
      ItemSize(in_stack_fffffffffffffef0,(float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
              (ImGuiID)((ulong)in_stack_fffffffffffffef0 >> 0x20),in_stack_fffffffffffffee8);
    }
  }
  return;
}

Assistant:

void ImGui::TextUnformatted(const char* text, const char* text_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(text != NULL);
    const char* text_begin = text;
    if (text_end == NULL)
        text_end = text + strlen(text); // FIXME-OPT

    const ImVec2 text_pos(window->DC.CursorPos.x, window->DC.CursorPos.y + window->DC.CurrentLineTextBaseOffset);
    const float wrap_pos_x = window->DC.TextWrapPos;
    const bool wrap_enabled = wrap_pos_x >= 0.0f;
    if (text_end - text > 2000 && !wrap_enabled)
    {
        // Long text!
        // Perform manual coarse clipping to optimize for long multi-line text
        // - From this point we will only compute the width of lines that are visible. Optimization only available when word-wrapping is disabled.
        // - We also don't vertically center the text within the line full height, which is unlikely to matter because we are likely the biggest and only item on the line.
        // - We use memchr(), pay attention that well optimized versions of those str/mem functions are much faster than a casually written loop.
        const char* line = text;
        const float line_height = GetTextLineHeight();
        const ImRect clip_rect = window->ClipRect;
        ImVec2 text_size(0,0);

        if (text_pos.y <= clip_rect.Max.y)
        {
            ImVec2 pos = text_pos;

            // Lines to skip (can't skip when logging text)
            if (!g.LogEnabled)
            {
                int lines_skippable = (int)((clip_rect.Min.y - text_pos.y) / line_height);
                if (lines_skippable > 0)
                {
                    int lines_skipped = 0;
                    while (line < text_end && lines_skipped < lines_skippable)
                    {
                        const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                        if (!line_end)
                            line_end = text_end;
                        line = line_end + 1;
                        lines_skipped++;
                    }
                    pos.y += lines_skipped * line_height;
                }
            }

            // Lines to render
            if (line < text_end)
            {
                ImRect line_rect(pos, pos + ImVec2(FLT_MAX, line_height));
                while (line < text_end)
                {
                    if (IsClippedEx(line_rect, 0, false))
                        break;

                    const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                    if (!line_end)
                        line_end = text_end;
                    const ImVec2 line_size = CalcTextSize(line, line_end, false);
                    text_size.x = ImMax(text_size.x, line_size.x);
                    RenderText(pos, line, line_end, false);
                    line = line_end + 1;
                    line_rect.Min.y += line_height;
                    line_rect.Max.y += line_height;
                    pos.y += line_height;
                }

                // Count remaining lines
                int lines_skipped = 0;
                while (line < text_end)
                {
                    const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                    if (!line_end)
                        line_end = text_end;
                    line = line_end + 1;
                    lines_skipped++;
                }
                pos.y += lines_skipped * line_height;
            }

            text_size.y += (pos - text_pos).y;
        }

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size);
        ItemAdd(bb, 0);
    }
    else
    {
        const float wrap_width = wrap_enabled ? CalcWrapWidthForPos(window->DC.CursorPos, wrap_pos_x) : 0.0f;
        const ImVec2 text_size = CalcTextSize(text_begin, text_end, false, wrap_width);

        // Account of baseline offset
        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size);
        if (!ItemAdd(bb, 0))
            return;

        // Render (we don't hide text after ## in this end-user function)
        RenderTextWrapped(bb.Min, text_begin, text_end, wrap_width);
    }
}